

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTPNListBase::get_const_ele(CTPNListBase *this,int index)

{
  bool bVar1;
  uint uVar2;
  
  if (0 < index) {
    do {
      this = (CTPNListBase *)this->head_;
      uVar2 = index - 1;
      if (this == (CTPNListBase *)0x0) break;
      bVar1 = 1 < (uint)index;
      index = uVar2;
    } while (bVar1);
    if (uVar2 == 0 && this != (CTPNListBase *)0x0) {
      return *(CTcPrsNode **)&this->cnt_;
    }
  }
  CTcTokenizer::log_error(0x2b10);
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTPNListBase::get_const_ele(int index)
{
    CTPNListEle *ele;
    
    /* if the index is negative, it's out of range */
    if (index < 1)
    {
        /* log the error and return failure */
        G_tok->log_error(TCERR_CONST_IDX_RANGE);
        return 0;
    }

    /* scan the list for the given element */
    for (ele = head_ ; ele != 0 && index > 1 ;
         ele = ele->get_next(), --index) ;

    /* if we ran out of elements, the index is out of range */
    if (ele == 0 || index != 1)
    {
        G_tok->log_error(TCERR_CONST_IDX_RANGE);
        return 0;
    }

    /* return the element's constant value */
    return ele->get_expr();
}